

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generator.cc
# Opt level: O0

void __thiscall pass_replace_Test::TestBody(pass_replace_Test *this)

{
  bool bVar1;
  Generator *pGVar2;
  Port *pPVar3;
  string *psVar4;
  char *pcVar5;
  uint32_t *puVar6;
  mapped_type *pmVar7;
  long lVar8;
  Generator *top;
  char *in_R9;
  string local_918;
  AssertHelper local_8f8;
  Message local_8f0;
  bool local_8e1;
  undefined1 local_8e0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_8b0;
  Message local_8a8;
  bool local_899;
  undefined1 local_898 [8];
  AssertionResult gtest_ar_;
  key_type local_880;
  string local_860 [8];
  mapped_type src;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mod_src;
  Message local_808;
  int local_7fc;
  uint64_t local_7f8;
  undefined1 local_7f0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_7c0;
  Message local_7b8 [6];
  exception *e_4;
  undefined1 auStack_778 [8];
  TrueWithString gtest_msg_4;
  AssertHelper local_750;
  Message local_748 [2];
  VarException *anon_var_0_3;
  type e_3;
  byte local_6f9;
  undefined1 auStack_6f8 [7];
  bool gtest_caught_expected_3;
  TrueWithString gtest_msg_3;
  AssertHelper local_6d0;
  Message local_6c8 [2];
  VarException *anon_var_0_2;
  type e_2;
  byte local_679;
  undefined1 auStack_678 [7];
  bool gtest_caught_expected_2;
  TrueWithString gtest_msg_2;
  AssertHelper local_650;
  Message local_648 [2];
  VarException *anon_var_0_1;
  type e_1;
  byte local_5f9;
  undefined1 auStack_5f8 [7];
  bool gtest_caught_expected_1;
  TrueWithString gtest_msg_1;
  Message local_5d0 [2];
  VarException *anon_var_0;
  type e;
  enable_shared_from_this<kratos::Generator> local_590;
  byte local_579;
  undefined1 auStack_578 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  Generator *local_4d8;
  Generator *mod6;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  Generator *local_458;
  Generator *mod5;
  shared_ptr<kratos::Stmt> local_440;
  undefined1 local_430 [32];
  enable_shared_from_this<kratos::Generator> local_410;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358;
  Generator *local_338;
  Generator *mod4;
  shared_ptr<kratos::Stmt> local_320;
  allocator<char> local_309;
  string local_308;
  Port *local_2e8;
  Port *out3;
  string local_2d8;
  Port *local_2b8;
  Port *in3;
  string local_2a8;
  Generator *local_288;
  Generator *mod3;
  shared_ptr<kratos::Stmt> local_270;
  allocator<char> local_259;
  string local_258;
  Port *local_238;
  Port *out2;
  string local_228;
  __node_base local_208;
  Port *in2;
  string local_1f8;
  Generator *local_1d8;
  Generator *mod2;
  string local_1c8;
  Port *local_1a8;
  Port *out1;
  string local_198;
  undefined8 local_178;
  Port *in1;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod1;
  Context c;
  pass_replace_Test *this_local;
  
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"module1",&local_159);
  pGVar2 = kratos::Context::generator((Context *)&mod1,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"in",(allocator<char> *)((long)&out1 + 7));
  pPVar3 = kratos::Generator::port(pGVar2,In,&local_198,1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&out1 + 7));
  pGVar2 = local_138;
  local_178 = pPVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"out",(allocator<char> *)((long)&mod2 + 7));
  pPVar3 = kratos::Generator::port(pGVar2,Out,&local_1c8,1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&mod2 + 7));
  local_1a8 = pPVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"module2",(allocator<char> *)((long)&in2 + 7));
  pGVar2 = kratos::Context::generator((Context *)&mod1,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&in2 + 7));
  local_1d8 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"in",(allocator<char> *)((long)&out2 + 7));
  pPVar3 = kratos::Generator::port(pGVar2,In,&local_228,1);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)((long)&out2 + 7));
  pGVar2 = local_1d8;
  local_208._M_nxt = (_Hash_node_base *)pPVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"out",&local_259);
  pPVar3 = kratos::Generator::port(pGVar2,Out,&local_258,1);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  pGVar2 = local_1d8;
  local_238 = pPVar3;
  kratos::Var::assign((Var *)&mod3,&pPVar3->super_Var);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_270,(shared_ptr<kratos::AssignStmt> *)&mod3);
  kratos::Generator::add_stmt(pGVar2,&local_270);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_270);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)&mod3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"module3",(allocator<char> *)((long)&in3 + 7));
  pGVar2 = kratos::Context::generator((Context *)&mod1,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&in3 + 7));
  local_288 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"in",(allocator<char> *)((long)&out3 + 7));
  pPVar3 = kratos::Generator::port(pGVar2,In,&local_2d8,2);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&out3 + 7));
  pGVar2 = local_288;
  local_2b8 = pPVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"out",&local_309);
  pPVar3 = kratos::Generator::port(pGVar2,Out,&local_308,2);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  pGVar2 = local_288;
  local_2e8 = pPVar3;
  kratos::Var::assign((Var *)&mod4,&pPVar3->super_Var);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_320,(shared_ptr<kratos::AssignStmt> *)&mod4);
  kratos::Generator::add_stmt(pGVar2,&local_320);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_320);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)&mod4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"module4",&local_359);
  pGVar2 = kratos::Context::generator((Context *)&mod1,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  local_338 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"in",&local_381);
  kratos::Generator::port(pGVar2,In,&local_380,1);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  pGVar2 = local_338;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"out",&local_3a9);
  kratos::Generator::port(pGVar2,Out,&local_3a8,1);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  pGVar2 = local_338;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"out2",&local_3d1);
  kratos::Generator::port(pGVar2,Out,&local_3d0,1);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"inst0",&local_3f9);
  std::enable_shared_from_this<kratos::Generator>::shared_from_this(&local_410);
  kratos::Generator::add_child_generator
            (pGVar2,&local_3f8,(shared_ptr<kratos::Generator> *)&local_410);
  std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&local_410);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  pGVar2 = local_138;
  kratos::Var::assign((Var *)local_430,(Var *)local_208._M_nxt);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_430 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_430);
  kratos::Generator::add_stmt(pGVar2,(shared_ptr<kratos::Stmt> *)(local_430 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_430 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_430);
  pGVar2 = local_138;
  kratos::Var::assign((Var *)&mod5,&local_1a8->super_Var);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_440,(shared_ptr<kratos::AssignStmt> *)&mod5);
  kratos::Generator::add_stmt(pGVar2,&local_440);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_440);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)&mod5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"module5",&local_479);
  pGVar2 = kratos::Context::generator((Context *)&mod1,&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  local_458 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"in",&local_4a1);
  kratos::Generator::port(pGVar2,Out,&local_4a0,1);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  pGVar2 = local_458;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"out",(allocator<char> *)((long)&mod6 + 7));
  kratos::Generator::port(pGVar2,Out,&local_4c8,1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&mod6 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"module6",&local_4f9);
  pGVar2 = kratos::Context::generator((Context *)&mod1,&local_4f8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  local_4d8 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"in",&local_521);
  kratos::Generator::port(pGVar2,In,&local_520,1,Clock);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  pGVar2 = local_4d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"out",&local_549);
  kratos::Generator::port(pGVar2,Out,&local_548,1);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_578[0] = (_Alloc_hider)0x0;
  stack0xfffffffffffffa89 = 0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_578);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_578);
  if (bVar1) {
    local_579 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    pGVar2 = local_138;
    if (bVar1) {
      psVar4 = &local_1d8->instance_name;
      std::enable_shared_from_this<kratos::Generator>::shared_from_this(&local_590);
      kratos::Generator::replace(pGVar2,psVar4,(shared_ptr<kratos::Generator> *)&local_590);
      std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&local_590);
    }
    if ((local_579 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)auStack_578,
                 "Expected: mod1.replace(mod2.instance_name, mod3.shared_from_this()) throws an exception of type VarException.\n  Actual: it throws nothing."
                );
      goto LAB_0014382f;
    }
  }
  else {
LAB_0014382f:
    testing::Message::Message(local_5d0);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&gtest_msg_1.value.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
               ,0x8b,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&gtest_msg_1.value.field_2 + 8),local_5d0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&gtest_msg_1.value.field_2 + 8));
    testing::Message::~Message(local_5d0);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_578);
  gtest_msg_1.value._M_string_length = 0;
  gtest_msg_1.value.field_2._M_allocated_capacity = 0;
  auStack_5f8[0] = (_Alloc_hider)0x0;
  stack0xfffffffffffffa09 = 0;
  gtest_msg_1.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_1.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_5f8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_5f8);
  if (bVar1) {
    local_5f9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    pGVar2 = local_138;
    if (bVar1) {
      psVar4 = &local_1d8->instance_name;
      std::enable_shared_from_this<kratos::Generator>::shared_from_this
                ((enable_shared_from_this<kratos::Generator> *)&e_1);
      kratos::Generator::replace(pGVar2,psVar4,(shared_ptr<kratos::Generator> *)&e_1);
      std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&e_1);
    }
    if ((local_5f9 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)auStack_5f8,
                 "Expected: mod1.replace(mod2.instance_name, mod4.shared_from_this()) throws an exception of type VarException.\n  Actual: it throws nothing."
                );
      goto LAB_00143bed;
    }
  }
  else {
LAB_00143bed:
    testing::Message::Message(local_648);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_650,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
               ,0x8c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_650,local_648);
    testing::internal::AssertHelper::~AssertHelper(&local_650);
    testing::Message::~Message(local_648);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_5f8);
  gtest_msg_2.value._M_string_length = 0;
  gtest_msg_2.value.field_2._M_allocated_capacity = 0;
  auStack_678[0] = (_Alloc_hider)0x0;
  stack0xfffffffffffff989 = 0;
  gtest_msg_2.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_2.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_678);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_678);
  if (bVar1) {
    local_679 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    pGVar2 = local_138;
    if (bVar1) {
      psVar4 = &local_1d8->instance_name;
      std::enable_shared_from_this<kratos::Generator>::shared_from_this
                ((enable_shared_from_this<kratos::Generator> *)&e_2);
      kratos::Generator::replace(pGVar2,psVar4,(shared_ptr<kratos::Generator> *)&e_2);
      std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&e_2);
    }
    if ((local_679 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)auStack_678,
                 "Expected: mod1.replace(mod2.instance_name, mod5.shared_from_this()) throws an exception of type VarException.\n  Actual: it throws nothing."
                );
      goto LAB_00143fab;
    }
  }
  else {
LAB_00143fab:
    testing::Message::Message(local_6c8);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
               ,0x8d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_6d0,local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6d0);
    testing::Message::~Message(local_6c8);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_678);
  gtest_msg_3.value._M_string_length = 0;
  gtest_msg_3.value.field_2._M_allocated_capacity = 0;
  auStack_6f8[0] = (_Alloc_hider)0x0;
  stack0xfffffffffffff909 = 0;
  gtest_msg_3.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_3.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_6f8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_6f8);
  if (bVar1) {
    local_6f9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    pGVar2 = local_138;
    if (bVar1) {
      psVar4 = &local_1d8->instance_name;
      std::enable_shared_from_this<kratos::Generator>::shared_from_this
                ((enable_shared_from_this<kratos::Generator> *)&e_3);
      kratos::Generator::replace(pGVar2,psVar4,(shared_ptr<kratos::Generator> *)&e_3);
      std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&e_3);
    }
    if ((local_6f9 & 1) != 0) goto LAB_00144417;
    std::__cxx11::string::operator=
              ((string *)auStack_6f8,
               "Expected: mod1.replace(mod2.instance_name, mod6.shared_from_this()) throws an exception of type VarException.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_748);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_750,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
             ,0x8e,pcVar5);
  testing::internal::AssertHelper::operator=(&local_750,local_748);
  testing::internal::AssertHelper::~AssertHelper(&local_750);
  testing::Message::~Message(local_748);
LAB_00144417:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_6f8);
  puVar6 = kratos::Var::var_width(&local_2b8->super_Var);
  *puVar6 = 1;
  puVar6 = kratos::Var::var_width(&local_2e8->super_Var);
  *puVar6 = 1;
  gtest_msg_4.value._M_string_length = 0;
  gtest_msg_4.value.field_2._M_allocated_capacity = 0;
  auStack_778 = (undefined1  [8])0x0;
  gtest_msg_4.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_4.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_778);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_778);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    pGVar2 = local_138;
    if (bVar1) {
      psVar4 = &local_1d8->instance_name;
      std::enable_shared_from_this<kratos::Generator>::shared_from_this
                ((enable_shared_from_this<kratos::Generator> *)&e_4);
      kratos::Generator::replace(pGVar2,psVar4,(shared_ptr<kratos::Generator> *)&e_4);
      std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&e_4);
    }
  }
  else {
    testing::Message::Message(local_7b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gtest_ar.message_,
                   "Expected: mod1.replace(mod2.instance_name, mod3.shared_from_this()) doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_778
                  );
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
               ,0x91,pcVar5);
    testing::internal::AssertHelper::operator=(&local_7c0,local_7b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7c0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_7b8);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_778);
  local_7f8 = kratos::Generator::get_child_generator_size(local_138);
  local_7fc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_7f0,"mod1.get_child_generator_size()","1",&local_7f8,&local_7fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f0);
  if (!bVar1) {
    testing::Message::Message(&local_808);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_7f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mod_src._M_t._M_impl.super__Rb_tree_header._M_node_count,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
               ,0x92,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&mod_src._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_808)
    ;
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&mod_src._M_t._M_impl.super__Rb_tree_header._M_node_count);
    testing::Message::~Message(&local_808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f0);
  kratos::fix_assignment_type(local_138);
  kratos::create_module_instantiation(local_138);
  kratos::generate_verilog_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&src.field_2 + 8),(kratos *)local_138,top);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_880,"module1",
             (allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&src.field_2 + 8),&local_880);
  std::__cxx11::string::string(local_860,(string *)pmVar7);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  lVar8 = std::__cxx11::string::find((char *)local_860,0x4550b1);
  local_899 = lVar8 == -1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_898,&local_899,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_898);
  if (!bVar1) {
    testing::Message::Message(&local_8a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_898,
               (AssertionResult *)"src.find(\"module2\") == std::string::npos","false","true",in_R9)
    ;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
               ,0x97,pcVar5);
    testing::internal::AssertHelper::operator=(&local_8b0,&local_8a8);
    testing::internal::AssertHelper::~AssertHelper(&local_8b0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_8a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_898);
  lVar8 = std::__cxx11::string::find((char *)local_860,0x4550b9);
  local_8e1 = lVar8 != -1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8e0,&local_8e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e0);
  if (!bVar1) {
    testing::Message::Message(&local_8f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_918,(internal *)local_8e0,
               (AssertionResult *)"src.find(\"module3\") != std::string::npos","false","true",in_R9)
    ;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
               ,0x98,pcVar5);
    testing::internal::AssertHelper::operator=(&local_8f8,&local_8f0);
    testing::internal::AssertHelper::~AssertHelper(&local_8f8);
    std::__cxx11::string::~string((string *)&local_918);
    testing::Message::~Message(&local_8f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e0);
  std::__cxx11::string::~string(local_860);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)((long)&src.field_2 + 8));
  kratos::Context::~Context((Context *)&mod1);
  return;
}

Assistant:

TEST(pass, replace) {  // NOLINT
    Context c;
    auto &mod1 = c.generator("module1");
    auto &in1 = mod1.port(PortDirection::In, "in", 1);
    auto &out1 = mod1.port(PortDirection::Out, "out", 1);

    auto &mod2 = c.generator("module2");
    auto &in2 = mod2.port(PortDirection::In, "in", 1);
    auto &out2 = mod2.port(PortDirection::Out, "out", 1);
    mod2.add_stmt(out2.assign(in2));

    auto &mod3 = c.generator("module3");
    auto &in3 = mod3.port(PortDirection::In, "in", 2);
    auto &out3 = mod3.port(PortDirection::Out, "out", 2);
    mod3.add_stmt(out3.assign(in3));

    auto &mod4 = c.generator("module4");
    mod4.port(PortDirection::In, "in", 1);
    mod4.port(PortDirection::Out, "out", 1);
    mod4.port(PortDirection::Out, "out2", 1);

    mod1.add_child_generator("inst0", mod2.shared_from_this());
    mod1.add_stmt(in2.assign(in1));
    mod1.add_stmt(out1.assign(out2));

    auto &mod5 = c.generator("module5");
    mod5.port(PortDirection::Out, "in", 1);
    mod5.port(PortDirection::Out, "out", 1);

    auto &mod6 = c.generator("module6");
    mod6.port(PortDirection::In, "in", 1, PortType::Clock);
    mod6.port(PortDirection::Out, "out", 1);

    EXPECT_THROW(mod1.replace(mod2.instance_name, mod3.shared_from_this()), VarException);
    EXPECT_THROW(mod1.replace(mod2.instance_name, mod4.shared_from_this()), VarException);
    EXPECT_THROW(mod1.replace(mod2.instance_name, mod5.shared_from_this()), VarException);
    EXPECT_THROW(mod1.replace(mod2.instance_name, mod6.shared_from_this()), VarException);
    in3.var_width() = 1;
    out3.var_width() = 1;
    EXPECT_NO_THROW(mod1.replace(mod2.instance_name, mod3.shared_from_this()));
    EXPECT_EQ(mod1.get_child_generator_size(), 1);
    fix_assignment_type(&mod1);
    create_module_instantiation(&mod1);
    auto mod_src = generate_verilog(&mod1);
    auto src = mod_src["module1"];
    EXPECT_TRUE(src.find("module2") == std::string::npos);
    EXPECT_TRUE(src.find("module3") != std::string::npos);
}